

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_math.cpp
# Opt level: O0

float fast_sqrt(float x)

{
  uint i;
  float x_local;
  
  return (float)((int)x + 0x3f800000U >> 1);
}

Assistant:

float fast_sqrt(float x)
 {
   unsigned int i = *(unsigned int*) &x; 
   // adjust bias
   i  += 127 << 23;
   // approximation of square root
   i >>= 1; 
   return *(float*) &i;
 }